

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

void RigidBodyDynamics::CalcPointJacobian6D
               (Model *model,VectorNd *Q,uint body_id,Vector3d *point_position,MatrixNd *G,
               bool update_kinematics)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  uint in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_R8;
  byte in_R9B;
  uint k;
  uint q_index;
  uint j;
  uint fbody_id;
  uint reference_body_id;
  SpatialTransform point_trans;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff908;
  MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffff910;
  Matrix3d *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  uint in_stack_fffffffffffff924;
  Model *in_stack_fffffffffffff928;
  uint in_stack_fffffffffffff938;
  int in_stack_fffffffffffff93c;
  Index in_stack_fffffffffffff940;
  Index in_stack_fffffffffffff948;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff950;
  SpatialTransform *in_stack_fffffffffffff9a8;
  SpatialTransform *in_stack_fffffffffffff9d0;
  SpatialTransform *in_stack_fffffffffffff9d8;
  SpatialVector *in_stack_fffffffffffffad0;
  SpatialTransform *in_stack_fffffffffffffad8;
  SpatialTransform *in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb1f;
  Vector3d *in_stack_fffffffffffffb20;
  uint in_stack_fffffffffffffb2c;
  VectorNd *in_stack_fffffffffffffb30;
  Model *in_stack_fffffffffffffb38;
  VectorNd *in_stack_fffffffffffffd78;
  VectorNd *in_stack_fffffffffffffd80;
  VectorNd *in_stack_fffffffffffffd88;
  Model *in_stack_fffffffffffffd90;
  uint local_104;
  uint local_fc;
  
  if ((in_R9B & 1) != 0) {
    UpdateKinematicsCustom
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  CalcBodyToBaseCoordinates
            (in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
             in_stack_fffffffffffffb20,(bool)in_stack_fffffffffffffb1f);
  Math::SpatialTransform::SpatialTransform
            ((SpatialTransform *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             in_stack_fffffffffffff918,(Vector3d *)in_stack_fffffffffffff910);
  bVar3 = Model::IsFixedBodyId(in_stack_fffffffffffff928,in_stack_fffffffffffff924);
  local_fc = in_EDX;
  if (bVar3) {
    pvVar4 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RDI + 0x21),
                          (ulong)(in_EDX - *(int *)&in_RDI[0x22].
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
    local_fc = pvVar4->mMovableParent;
  }
  local_104 = local_fc;
  while (local_104 != 0) {
    pvVar5 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_104);
    uVar1 = pvVar5->q_index;
    pvVar5 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&in_RDI[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_104);
    if (pvVar5->mJointType == JointTypeCustom) {
      pvVar5 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&in_RDI[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_104);
      uVar2 = pvVar5->custom_joint_index;
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(in_RDI + 0x20),(ulong)local_104);
      Math::SpatialTransform::inverse(in_stack_fffffffffffff9a8);
      Math::SpatialTransform::operator*(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
      Math::SpatialTransform::toMatrix(in_stack_fffffffffffffb00);
      std::
      vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>::
      operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  *)&in_RDI[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                (in_stack_fffffffffffff910,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff908)
      ;
      std::
      vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>::
      operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  *)&in_RDI[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
      Eigen::
      DenseBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
      ::block<int,unsigned_int>
                ((DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                 in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      in_stack_fffffffffffff918 = (Matrix3d *)(ulong)uVar1;
      in_stack_fffffffffffff910 = in_R8;
      std::
      vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>::
      operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                  *)&in_RDI[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                 in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffff910,
                 (DenseBase<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false>_>
                  *)in_stack_fffffffffffff908);
    }
    else {
      pvVar5 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)&in_RDI[6].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_104);
      if (pvVar5->mDoFCount == 1) {
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      *)(in_RDI + 0x20),(ulong)local_104);
        Math::SpatialTransform::inverse(in_stack_fffffffffffff9a8);
        std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                  ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                   &in_RDI[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_104);
        Math::SpatialTransform::apply(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
        Math::SpatialTransform::apply(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
        Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<6,1>
                  ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   (Index)in_stack_fffffffffffff918,(Index)in_stack_fffffffffffff910);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                   in_stack_fffffffffffff910,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_6,_1,_false>_> *)
                   in_stack_fffffffffffff908);
      }
      else {
        pvVar5 = std::
                 vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                               *)&in_RDI[6].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_104
                             );
        if (pvVar5->mDoFCount == 3) {
          std::
          vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                        *)(in_RDI + 0x20),(ulong)local_104);
          Math::SpatialTransform::inverse(in_stack_fffffffffffff9a8);
          Math::SpatialTransform::operator*(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
          Math::SpatialTransform::toMatrix(in_stack_fffffffffffffb00);
          std::
          vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
          ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        *)&in_RDI[0xe].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)local_104);
          Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
                    (in_stack_fffffffffffff910,
                     (MatrixBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)in_stack_fffffffffffff908)
          ;
          Eigen::
          DenseBase<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,3,0,6,3>,0>>
          ::block<6,3>((DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>
                        *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                       (Index)in_stack_fffffffffffff918,(Index)in_stack_fffffffffffff910);
          Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                    (in_stack_fffffffffffff950,in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                     in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
          Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                     in_stack_fffffffffffff910,
                     (DenseBase<Eigen::Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>,_6,_3,_false>_>
                      *)in_stack_fffffffffffff908);
        }
      }
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_104);
    local_104 = *pvVar6;
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcPointJacobian6D (
    Model &model,
    const VectorNd &Q,
    unsigned int body_id,
    const Vector3d &point_position,
    MatrixNd &G,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // update the Kinematics if necessary
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  SpatialTransform point_trans =
    SpatialTransform (Matrix3d::Identity(),
        CalcBodyToBaseCoordinates (model,
          Q,
          body_id,
          point_position,
          false));

  assert (G.rows() == 6 && G.cols() == model.qdot_size );

  unsigned int reference_body_id = body_id;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
  }

  unsigned int j = reference_body_id;

  while (j != 0) {
    unsigned int q_index = model.mJoints[j].q_index;

    if(model.mJoints[j].mJointType != JointTypeCustom){
      if (model.mJoints[j].mDoFCount == 1) {
        G.block(0,q_index, 6, 1)
          = point_trans.apply(
              model.X_base[j].inverse().apply(
                model.S[j])).block<6, 1>(0,0);
      } else if (model.mJoints[j].mDoFCount == 3) {
        G.block(0, q_index, 6, 3)
          = ((point_trans
                * model.X_base[j].inverse()).toMatrix()
              * model.multdof3_S[j]).block<6, 3>(0,0);
      }
    } else {
      unsigned int k = model.mJoints[j].custom_joint_index;

      G.block(0, q_index, 6, model.mCustomJoints[k]->mDoFCount)
        = ((point_trans
              * model.X_base[j].inverse()).toMatrix()
            * model.mCustomJoints[k]->S).block(
              0,0,6,model.mCustomJoints[k]->mDoFCount);
    }

    j = model.lambda[j];
  }
}